

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void rename_regs(gen_ctx_t gen_ctx)

{
  MIR_insn_t insn_00;
  int iVar1;
  bb_t_conflict pbVar2;
  bb_t_conflict local_68;
  bb_t_conflict bb_1;
  size_t i;
  bb_t_conflict bb;
  insn_var_iterator_t iter;
  ssa_edge_t_conflict ssa_edge;
  MIR_insn_t insn;
  MIR_reg_t var;
  int op_num;
  bb_insn_t_conflict bb_insn;
  gen_ctx_t gen_ctx_local;
  
  bb_insn = (bb_insn_t_conflict)gen_ctx;
  for (i = (size_t)DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); i != 0;
      i = (size_t)DLIST_bb_t_next((bb_t_conflict)i)) {
    for (_var = DLIST_bb_insn_t_head((DLIST_bb_insn_t *)(i + 0x50)); _var != (bb_insn_t_conflict)0x0
        ; _var = DLIST_bb_insn_t_next(_var)) {
      insn_00 = _var->insn;
      insn_var_iterator_init((insn_var_iterator_t *)&bb,insn_00);
      while (iVar1 = input_insn_var_iterator_next
                               ((gen_ctx_t)bb_insn,(insn_var_iterator_t *)&bb,(MIR_reg_t *)&insn,
                                (int *)((long)&insn + 4)), iVar1 != 0) {
        if ((0x21 < (uint)insn) &&
           (iVar1 = MIR_addr_code_p((MIR_insn_code_t)*(undefined8 *)&insn_00->field_0x18),
           iVar1 == 0)) {
          iter.op_part_num = (size_t)insn_00->ops[insn._4_4_].data;
          *(undefined1 *)(iter.op_part_num + 0x10) = 0;
        }
      }
    }
  }
  for (bb_1 = (bb_t_conflict)0x0;
      pbVar2 = (bb_t_conflict)
               VARR_bb_insn_tlength(*(VARR_bb_insn_t **)bb_insn[3].insn_dead_vars.tail),
      bb_1 < pbVar2; bb_1 = (bb_t_conflict)((long)&bb_1->index + 1)) {
    _var = VARR_bb_insn_tget(*(VARR_bb_insn_t **)bb_insn[3].insn_dead_vars.tail,(size_t)bb_1);
    if (_var != (bb_insn_t_conflict)0x0) {
      rename_bb_insn((gen_ctx_t)bb_insn,_var);
    }
  }
  for (local_68 = DLIST_bb_t_head((DLIST_bb_t *)&(bb_insn[3].insn)->field_0x18);
      local_68 != (bb_t_conflict)0x0; local_68 = DLIST_bb_t_next(local_68)) {
    for (_var = DLIST_bb_insn_t_head(&local_68->bb_insns); _var != (bb_insn_t_conflict)0x0;
        _var = DLIST_bb_insn_t_next(_var)) {
      rename_bb_insn((gen_ctx_t)bb_insn,_var);
    }
  }
  return;
}

Assistant:

static void rename_regs (MIR_context_t ctx, MIR_func_t func, MIR_func_t called_func,
                         VARR (MIR_var_t) * vars, size_t nvars) {
  char buff[50];
  const char *hard_reg_name;
  MIR_var_t var;
  MIR_type_t type;
  MIR_reg_t old_reg, new_reg;

  if (vars == NULL) return;
  for (size_t i = 0; i < nvars; i++) {
    VARR_TRUNC (char, temp_string, 0);
    sprintf (buff, ".c%d_", func->n_inlines);
    VARR_PUSH_ARR (char, temp_string, buff, strlen (buff));
    var = VARR_GET (MIR_var_t, vars, i);
    type
      = (var.type == MIR_T_F || var.type == MIR_T_D || var.type == MIR_T_LD ? var.type : MIR_T_I64);
    old_reg = MIR_reg (ctx, var.name, called_func);
    VARR_PUSH_ARR (char, temp_string, var.name, strlen (var.name) + 1);
    if ((hard_reg_name = MIR_reg_hard_reg_name (ctx, old_reg, called_func)) != NULL) {
      new_reg
        = MIR_new_global_func_reg (ctx, func, type, VARR_ADDR (char, temp_string), hard_reg_name);
    } else {
      new_reg = MIR_new_func_reg (ctx, func, type, VARR_ADDR (char, temp_string));
    }
    set_inline_reg_map (ctx, old_reg, new_reg);
  }
}